

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *pFVar2;
  LogMessage *other;
  undefined4 extraout_var_00;
  long *plVar3;
  LogFinisher local_61;
  undefined1 local_60 [56];
  
  iVar1 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"uninterpreted_option","");
  pFVar2 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(extraout_var,iVar1),(string *)local_60);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (pFVar2 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1838);
    other = internal::LogMessage::operator<<((LogMessage *)local_60,"CHECK failed: field != NULL: ")
    ;
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_60);
  }
  iVar1 = (*(options->super_MessageLite)._vptr_MessageLite[0x16])(options);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 600))
                             ((long *)CONCAT44(extraout_var_00,iVar1),options,pFVar2,0);
  (**(code **)(*plVar3 + 0x88))(plVar3,uninterpreted_option);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
    options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(field != NULL);

  options->GetReflection()->AddMessage(options, field)
    ->CopyFrom(uninterpreted_option);
}